

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsedscene.cpp
# Opt level: O0

void __thiscall
pbrt::FormattingScene::ObjectInstance(FormattingScene *this,string *name,FileLoc loc)

{
  bool bVar1;
  long in_RDI;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_ffffffffffffff48;
  string local_90 [4];
  int in_stack_ffffffffffffff74;
  FormattingScene *in_stack_ffffffffffffff78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff88;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_ffffffffffffff90;
  string local_40 [32];
  _Self local_20;
  _Self local_18 [3];
  
  if ((*(byte *)(in_RDI + 0x11) & 1) == 0) {
    indent_abi_cxx11_(in_stack_ffffffffffffff78,in_stack_ffffffffffffff74);
    Printf<std::__cxx11::string,std::__cxx11::string_const&>
              ((char *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,in_stack_ffffffffffffff80
              );
    std::__cxx11::string::~string(local_90);
  }
  else {
    local_18[0]._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::find(in_stack_ffffffffffffff48,(key_type *)0x9de6a7);
    local_20._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::end(in_stack_ffffffffffffff48);
    bVar1 = std::operator==(local_18,&local_20);
    if (bVar1) {
      indent_abi_cxx11_(in_stack_ffffffffffffff78,in_stack_ffffffffffffff74);
      Printf<std::__cxx11::string,std::__cxx11::string_const&>
                ((char *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,
                 in_stack_ffffffffffffff80);
      std::__cxx11::string::~string(local_40);
    }
    else {
      indent_abi_cxx11_(in_stack_ffffffffffffff78,in_stack_ffffffffffffff74);
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator[](in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
      Printf<std::__cxx11::string,std::__cxx11::string&>
                ((char *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,
                 in_stack_ffffffffffffff80);
      std::__cxx11::string::~string((string *)&stack0xffffffffffffff90);
    }
  }
  return;
}

Assistant:

void FormattingScene::ObjectInstance(const std::string &name, FileLoc loc) {
    if (upgrade) {
        if (definedObjectInstances.find(name) == definedObjectInstances.end())
            // this is legit if we're upgrading multiple files separately...
            Printf("%sObjectInstance \"%s\"\n", indent(), name);
        else
            // use the most recent renaming of it
            Printf("%sObjectInstance \"%s\"\n", indent(), definedObjectInstances[name]);
    } else
        Printf("%sObjectInstance \"%s\"\n", indent(), name);
}